

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_extend_scanned_scalar(Parser *this,csubstr s)

{
  State *pSVar1;
  pfn_error p_Var2;
  Location LVar3;
  Location LVar4;
  ro_substr chars;
  substr s_00;
  substr s_01;
  substr s_02;
  ro_substr chars_00;
  csubstr currscalar;
  csubstr cVar5;
  csubstr peeked_line;
  csubstr currscalar_00;
  csubstr peeked_line_00;
  csubstr currscalar_01;
  bool bVar6;
  int iVar7;
  error_flags eVar8;
  LineContents *pLVar9;
  size_t in_RDX;
  char *in_RSI;
  Parser *in_RDI;
  csubstr cVar10;
  substr full_2;
  csubstr n_2;
  char msg_1 [30];
  substr full_1;
  char msg [56];
  csubstr n_1;
  size_t scalar_indentation_1;
  substr full;
  csubstr n;
  size_t scalar_indentation;
  size_t in_stack_fffffffffffffca0;
  size_t in_stack_fffffffffffffca8;
  size_t in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffcb8;
  Location *in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  csubstr *pcVar11;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 uVar12;
  size_t local_2e0;
  char *local_2c0;
  size_t local_2b8;
  csubstr local_280;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  size_t local_250;
  char local_248 [40];
  char *local_220;
  ulong local_218;
  char *local_210;
  size_t local_208;
  char *local_200;
  size_t local_1f8;
  char *local_1f0;
  size_t local_1e8;
  char *local_1e0;
  char *indentation;
  Parser *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  undefined8 uStack_1b8;
  size_t local_1b0;
  char local_1a8 [56];
  char *local_170;
  size_t local_168;
  csubstr local_160;
  long local_150;
  Parser *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  size_t local_120;
  basic_substring<char_const> local_108 [16];
  char *local_f8;
  size_t local_f0;
  char *local_e8;
  size_t local_e0;
  substr local_d8;
  basic_substring<char> local_c8;
  csubstr local_b8;
  size_t local_a8;
  basic_substring<const_char> local_98;
  Parser *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  Parser *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  
  local_98.str = in_RSI;
  local_98.len = in_RDX;
  indentation = local_1e0;
  bVar6 = has_all(in_RDI,100);
  if (bVar6) {
    bVar6 = has_any(in_RDI,0x10);
    if (bVar6) {
      local_2e0 = 0;
    }
    else {
      local_2e0 = in_RDI->m_state->scalar_col;
    }
    local_a8 = local_2e0;
    local_b8 = _scan_to_next_nonempty_line
                         ((Parser *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                          (size_t)in_stack_fffffffffffffd00);
    pcVar11 = &local_b8;
    uVar12 = local_b8.len == 0 || local_b8.str == (char *)0x0;
    if (local_b8.len != 0 && local_b8.str != (char *)0x0) {
      local_e8 = local_98.str;
      local_e0 = local_98.len;
      local_f8 = local_b8.str;
      local_f0 = local_b8.len;
      currscalar.len = in_stack_fffffffffffffed8;
      currscalar.str = in_stack_fffffffffffffed0;
      cVar10.len = in_stack_fffffffffffffec8;
      cVar10.str = in_stack_fffffffffffffec0;
      local_d8 = _scan_complex_key(in_stack_fffffffffffffeb8,currscalar,cVar10);
      basic_substring<char_const>::basic_substring<5ul>(local_108,(char (*) [5])" \t\r\n");
      chars.len._0_7_ = in_stack_fffffffffffffd18;
      chars.str = (char *)pcVar11;
      chars.len._7_1_ = uVar12;
      local_c8 = basic_substring<char>::trimr
                           ((basic_substring<char> *)
                            CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),chars);
      iVar7 = basic_substring<char>::compare
                        ((basic_substring<char> *)
                         CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                         in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      if (iVar7 != 0) {
        s_00.len = in_stack_fffffffffffffe40;
        s_00.str = in_stack_fffffffffffffe38;
        cVar10 = _filter_plain_scalar(in_stack_fffffffffffffe30,s_00,(size_t)indentation);
        local_98.str = cVar10.str;
        local_120 = cVar10.len;
        local_98.len = local_120;
      }
    }
  }
  else {
    basic_substring<char_const>::basic_substring<2ul>
              ((basic_substring<char_const> *)&stack0xfffffffffffffeb8,(char (*) [2])0x40df0d);
    chars_00.len = (size_t)in_stack_fffffffffffffec0;
    chars_00.str = (char *)in_stack_fffffffffffffeb8;
    bVar6 = basic_substring<const_char>::begins_with_any(&local_98,chars_00);
    if (!bVar6) {
      bVar6 = has_none(in_RDI,0x10);
      if (bVar6) {
        local_150 = in_RDI->m_state->indref + 1;
        bVar6 = has_all(in_RDI,2);
        if ((bVar6) && (local_150 == 1)) {
          local_150 = 0;
        }
        local_160 = _scan_to_next_nonempty_line
                              ((Parser *)
                               CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                               (size_t)in_stack_fffffffffffffd00);
        pcVar11 = &local_160;
        if (local_160.len != 0 && local_160.str != (char *)0x0) {
          pSVar1 = in_RDI->m_state;
          pLVar9 = &pSVar1->line_contents;
          local_170 = local_160.str;
          local_168 = local_160.len;
          if ((pSVar1->line_contents).full.len == 0) {
            bVar6 = false;
            if ((local_160.len == 0) && (bVar6 = false, local_160.str == (pLVar9->full).str)) {
              bVar6 = (pLVar9->full).str != (char *)0x0;
            }
          }
          else {
            bVar6 = false;
            if ((pLVar9->full).str <= local_160.str) {
              bVar6 = local_160.str + local_160.len <=
                      (pLVar9->full).str + (pSVar1->line_contents).full.len;
            }
          }
          if (!bVar6) {
            memcpy(local_1a8,"check failed: (m_state->line_contents.full.is_super(n))",0x38);
            eVar8 = get_error_flags();
            if (((eVar8 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
              trap_instruction();
            }
            p_Var2 = (in_RDI->m_stack).m_callbacks.m_error;
            Location::Location(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                               in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                               in_stack_fffffffffffffca0);
            LVar3.super_LineCol.line = (size_t)in_stack_fffffffffffffe38;
            LVar3.super_LineCol.offset = (size_t)in_stack_fffffffffffffe30;
            LVar3.super_LineCol.col = in_stack_fffffffffffffe40;
            LVar3.name.str = (char *)uStack_1b8;
            LVar3.name.len = local_1b0;
            (*p_Var2)(local_1a8,0x38,LVar3,(in_RDI->m_stack).m_callbacks.m_user_data);
          }
          local_1f0 = local_98.str;
          local_1e8 = local_98.len;
          local_200 = local_160.str;
          local_1f8 = local_160.len;
          currscalar_01.len = in_stack_ffffffffffffffb8;
          currscalar_01.str = in_stack_ffffffffffffffb0;
          peeked_line_00.len = in_stack_ffffffffffffffa8;
          peeked_line_00.str = in_stack_ffffffffffffffa0;
          _local_1e0 = _scan_plain_scalar_blck
                                 (in_stack_ffffffffffffff98,currscalar_01,peeked_line_00,
                                  (size_t)pcVar11);
          if (local_98.len <= indentation) {
            local_220 = local_1e0;
            s_01.len = in_stack_fffffffffffffe40;
            s_01.str = in_stack_fffffffffffffe38;
            local_218 = (ulong)indentation;
            cVar10 = _filter_plain_scalar(in_stack_fffffffffffffe30,s_01,(size_t)indentation);
            local_210 = cVar10.str;
            local_98.str = local_210;
            local_208 = cVar10.len;
            local_98.len = local_208;
          }
        }
      }
      else {
        bVar6 = has_all(in_RDI,0x10);
        if (!bVar6) {
          builtin_strncpy(local_248,"check failed: (has_all(FLOW))",0x1e);
          eVar8 = get_error_flags();
          if (((eVar8 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
            trap_instruction();
          }
          p_Var2 = (in_RDI->m_stack).m_callbacks.m_error;
          Location::Location(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                             in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                             in_stack_fffffffffffffca0);
          LVar4.super_LineCol.line = uStack_268;
          LVar4.super_LineCol.offset = local_270;
          LVar4.super_LineCol.col = local_260;
          LVar4.name.str = (char *)uStack_258;
          LVar4.name.len = local_250;
          (*p_Var2)(local_248,0x1e,LVar4,(in_RDI->m_stack).m_callbacks.m_user_data);
        }
        local_280 = _scan_to_next_nonempty_line
                              ((Parser *)
                               CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                               (size_t)in_stack_fffffffffffffd00);
        bVar6 = true;
        if (local_280.len != 0) {
          bVar6 = local_280.str == (char *)0x0;
        }
        if (!bVar6) {
          currscalar_00.len = (size_t)in_stack_ffffffffffffff98;
          currscalar_00.str = in_stack_ffffffffffffff90;
          peeked_line.len = (size_t)&local_280;
          peeked_line.str = in_stack_ffffffffffffff80;
          _scan_plain_scalar_flow(in_stack_ffffffffffffff78,currscalar_00,peeked_line);
          s_02.len = in_stack_fffffffffffffe40;
          s_02.str = in_stack_fffffffffffffe38;
          cVar10 = _filter_plain_scalar(in_stack_fffffffffffffe30,s_02,(size_t)indentation);
          local_2c0 = cVar10.str;
          local_98.str = local_2c0;
          local_2b8 = cVar10.len;
          local_98.len = local_2b8;
        }
      }
    }
  }
  cVar5.len = local_98.len;
  cVar5.str = local_98.str;
  return cVar5;
}

Assistant:

csubstr Parser::_extend_scanned_scalar(csubstr s)
{
    if(has_all(RMAP|RKEY|QMRK))
    {
        size_t scalar_indentation = has_any(FLOW) ? 0 : m_state->scalar_col;
        _c4dbgpf("extend_scalar: explicit key! indref={} scalar_indentation={} scalar_col={}", m_state->indref, scalar_indentation, m_state->scalar_col);
        csubstr n = _scan_to_next_nonempty_line(scalar_indentation);
        if(!n.empty())
        {
            substr full = _scan_complex_key(s, n).trimr(" \t\r\n");
            if(full != s)
                s = _filter_plain_scalar(full, scalar_indentation);
        }
    }
    // deal with plain (unquoted) scalars that continue to the next line
    else if(!s.begins_with_any("*")) // cannot be a plain scalar if it starts with * (that's an anchor reference)
    {
        _c4dbgpf("extend_scalar: line ended, scalar='{}'", s);
        if(has_none(FLOW))
        {
            size_t scalar_indentation = m_state->indref + 1;
            if(has_all(RUNK) && scalar_indentation == 1)
                scalar_indentation = 0;
            csubstr n = _scan_to_next_nonempty_line(scalar_indentation);
            if(!n.empty())
            {
                _c4dbgpf("rscalar[IMPL]: state_indref={} state_indentation={} scalar_indentation={}", m_state->indref, m_state->line_contents.indentation, scalar_indentation);
                _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.full.is_super(n));
                substr full = _scan_plain_scalar_blck(s, n, scalar_indentation);
                if(full.len >= s.len)
                    s = _filter_plain_scalar(full, scalar_indentation);
            }
        }
        else
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            csubstr n = _scan_to_next_nonempty_line(/*indentation*/0);
            if(!n.empty())
            {
                _c4dbgp("rscalar[FLOW]");
                substr full = _scan_plain_scalar_flow(s, n);
                s = _filter_plain_scalar(full, /*indentation*/0);
            }
        }
    }

    return s;
}